

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::TestUtil::ReflectionTester::F(ReflectionTester *this,string *name)

{
  Descriptor *this_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  bool bVar1;
  FileDescriptor *this_01;
  LogMessage *pLVar2;
  AlphaNum *b;
  LogMessage local_128;
  Voidify local_111;
  string_view local_110;
  AlphaNum local_f0;
  AlphaNum local_c0;
  string local_90;
  string_view local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  FieldDescriptor *local_20;
  FieldDescriptor *result;
  string *name_local;
  ReflectionTester *this_local;
  
  local_20 = (FieldDescriptor *)0x0;
  result = (FieldDescriptor *)name;
  name_local = (string *)this;
  local_30 = Descriptor::name(this->base_descriptor_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"TestAllExtensions");
  __y_00._M_str = local_40._M_str;
  __y_00._M_len = local_40._M_len;
  bVar1 = std::operator==(local_30,__y_00);
  b = (AlphaNum *)local_40._M_str;
  if (!bVar1) {
    local_50 = Descriptor::name(this->base_descriptor_);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,"TestPackedExtensions");
    __y._M_str = local_60._M_str;
    __y._M_len = local_60._M_len;
    bVar1 = std::operator==(local_50,__y);
    b = (AlphaNum *)local_60._M_str;
    if (!bVar1) {
      this_00 = this->base_descriptor_;
      local_110 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)result);
      local_20 = Descriptor::FindFieldByName(this_00,local_110);
      goto LAB_0074385f;
    }
  }
  this_01 = Descriptor::file(this->base_descriptor_);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,"_extension");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_90,(lts_20250127 *)&local_c0,&local_f0,b);
  local_70 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_90);
  local_20 = FileDescriptor::FindExtensionByName(this_01,local_70);
  std::__cxx11::string::~string((string *)&local_90);
LAB_0074385f:
  if (local_20 != (FieldDescriptor *)0x0) {
    return local_20;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
             ,0xb2,"result != nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_128);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_111,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_128)
  ;
}

Assistant:

inline const FieldDescriptor* TestUtil::ReflectionTester::F(
    const std::string& name) {
  const FieldDescriptor* result = nullptr;
  if (base_descriptor_->name() == "TestAllExtensions" ||
      base_descriptor_->name() == "TestPackedExtensions") {
    result = base_descriptor_->file()->FindExtensionByName(
        absl::StrCat(name, "_extension"));
  } else {
    result = base_descriptor_->FindFieldByName(name);
  }
  ABSL_CHECK(result != nullptr);
  return result;
}